

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O1

void Abc_NtkDontCareWinCollectRoots_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vRoots)

{
  uint uVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  long *plVar4;
  long lVar5;
  void **ppvVar6;
  int in_EDX;
  undefined8 extraout_RDX;
  undefined8 uVar7;
  undefined8 extraout_RDX_00;
  int iVar8;
  long lVar9;
  
  if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                  ,0x170,"void Abc_NtkDontCareWinCollectRoots_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  pAVar3 = pObj->pNtk;
  iVar8 = pObj->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar8 + 1,in_EDX);
  if (((long)iVar8 < 0) || ((pAVar3->vTravIds).nSize <= iVar8)) {
LAB_008745b5:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  if ((pAVar3->vTravIds).pArray[iVar8] != pObj->pNtk->nTravIds) {
    __assert_fail("Abc_NodeIsTravIdCurrent(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcOdc.c"
                  ,0x171,"void Abc_NtkDontCareWinCollectRoots_rec(Abc_Obj_t *, Vec_Ptr_t *)");
  }
  if ((pObj->vFanouts).nSize < 1) {
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    uVar7 = extraout_RDX;
    do {
      plVar4 = (long *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar9]];
      lVar5 = *plVar4;
      iVar8 = (int)plVar4[2];
      Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar8 + 1,(int)uVar7);
      if (((long)iVar8 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar8)) goto LAB_008745b5;
    } while ((*(int *)(*(long *)(lVar5 + 0xe8) + (long)iVar8 * 4) == *(int *)(*plVar4 + 0xd8)) &&
            (lVar9 = lVar9 + 1, uVar7 = extraout_RDX_00, lVar9 < (pObj->vFanouts).nSize));
  }
  if ((pObj->vFanouts).nSize <= (int)lVar9) {
    if ((pObj->vFanouts).nSize < 1) {
      return;
    }
    lVar9 = 0;
    do {
      Abc_NtkDontCareWinCollectRoots_rec
                ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar9]],vRoots);
      lVar9 = lVar9 + 1;
    } while (lVar9 < (pObj->vFanouts).nSize);
    return;
  }
  uVar1 = vRoots->nSize;
  if (0 < (long)(int)uVar1) {
    lVar9 = 0;
    do {
      if ((Abc_Obj_t *)vRoots->pArray[lVar9] == pObj) {
        return;
      }
      lVar9 = lVar9 + 1;
    } while ((int)uVar1 != lVar9);
  }
  uVar2 = vRoots->nCap;
  if (uVar1 == uVar2) {
    if ((int)uVar2 < 0x10) {
      if (vRoots->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc(0x80);
      }
      else {
        ppvVar6 = (void **)realloc(vRoots->pArray,0x80);
      }
      vRoots->pArray = ppvVar6;
      iVar8 = 0x10;
    }
    else {
      iVar8 = uVar2 * 2;
      if (iVar8 <= (int)uVar2) goto LAB_00874593;
      if (vRoots->pArray == (void **)0x0) {
        ppvVar6 = (void **)malloc((ulong)uVar2 << 4);
      }
      else {
        ppvVar6 = (void **)realloc(vRoots->pArray,(ulong)uVar2 << 4);
      }
      vRoots->pArray = ppvVar6;
    }
    vRoots->nCap = iVar8;
  }
LAB_00874593:
  iVar8 = vRoots->nSize;
  vRoots->nSize = iVar8 + 1;
  vRoots->pArray[iVar8] = pObj;
  return;
}

Assistant:

void Abc_NtkDontCareWinCollectRoots_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vRoots )
{
    Abc_Obj_t * pFanout;
    int i;
    assert( Abc_ObjIsNode(pObj) );
    assert( Abc_NodeIsTravIdCurrent(pObj) );
    // check if the node has all fanouts marked
    Abc_ObjForEachFanout( pObj, pFanout, i )
        if ( !Abc_NodeIsTravIdCurrent(pFanout) )
            break;
    // if some of the fanouts are unmarked, add the node to the root
    if ( i < Abc_ObjFanoutNum(pObj) ) 
    {
        Vec_PtrPushUnique( vRoots, pObj );
        return;
    }
    // otherwise, call recursively
    Abc_ObjForEachFanout( pObj, pFanout, i )
        Abc_NtkDontCareWinCollectRoots_rec( pFanout, vRoots );
}